

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O2

PAL_ERROR CorUnix::CreateThreadData(CPalThread **ppThread)

{
  PAL_ERROR PVar1;
  CPalThread *this;
  int *piVar2;
  SIZE_T SVar3;
  pthread_t pVar4;
  
  this = AllocTHREAD();
  if (this == (CPalThread *)0x0) {
    PVar1 = 0xe;
  }
  else {
    PVar1 = CPalThread::RunPreCreateInitializers(this);
    if (PVar1 == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      SVar3 = syscall(0xba);
      this->m_threadId = SVar3;
      pVar4 = pthread_self();
      this->m_pthreadSelf = pVar4;
      this->m_dwLwpId = 0;
      PVar1 = CPalThread::RunPostCreateInitializers(this);
      if (PVar1 == 0) {
        *ppThread = this;
        return 0;
      }
    }
    CPalThread::ReleaseThreadReference(this);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::CreateThreadData(
    CPalThread **ppThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;

    /* Create the thread object */
    pThread = AllocTHREAD();

    if (NULL == pThread)
    {
       palError = ERROR_OUTOFMEMORY;
       goto CreateThreadDataExit;
    }

    palError = pThread->RunPreCreateInitializers();

    if (NO_ERROR != palError)
    {
        goto CreateThreadDataExit;
    }

    pThread->SetLastError(0);

    pThread->m_threadId = THREADSilentGetCurrentThreadId();
    pThread->m_pthreadSelf = pthread_self();
#if HAVE_MACH_THREADS
    pThread->m_machPortSelf = pthread_mach_thread_np(pThread->m_pthreadSelf);
#endif
#if HAVE_THREAD_SELF
    pThread->m_dwLwpId = (DWORD) thread_self();
#elif HAVE__LWP_SELF
    pThread->m_dwLwpId = (DWORD) _lwp_self();
#else
    pThread->m_dwLwpId = 0;
#endif

    palError = pThread->RunPostCreateInitializers();
    if (NO_ERROR != palError)
    {
        goto CreateThreadDataExit;
    }

    *ppThread = pThread;

CreateThreadDataExit:

    if (NO_ERROR != palError)
    {
        if (NULL != pThread)
        {
            pThread->ReleaseThreadReference();
        }
    }

    return palError;
}